

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

void __thiscall mdsplit::mdsplitter::run_update_links(mdsplitter *this)

{
  initializer_list<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
  __l;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  reference __in;
  type *__re;
  type_conflict2 *ptVar4;
  reference pmVar5;
  reference str;
  difference_type dVar6;
  const_reference pvVar7;
  long lVar8;
  value_type *pvVar9;
  ostream *poVar10;
  difference_type dVar11;
  difference_type dVar12;
  string *psVar13;
  pointer pmVar14;
  ulong uVar15;
  ulong uVar16;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long> *local_420
  ;
  int local_404;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  char *local_3f0;
  ulong local_3e8;
  size_t new_begin_pos;
  string local_3c0;
  char *local_3a0;
  char *local_398;
  ulong local_390;
  size_t pos_1;
  path relative_url_1;
  undefined1 local_338 [8];
  path absolute_destination;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  local_308;
  string *local_300;
  mdsection *local_2f8;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  local_2f0;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  local_2e8;
  __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
  it;
  string header_slug;
  string local_2a0;
  char *local_280;
  char *local_278;
  ulong local_270;
  size_t pos;
  undefined1 local_240 [8];
  path relative_url;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  undefined8 local_200;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0 [6];
  bool is_single_dot_directory;
  bool is_anchor;
  string url;
  size_t line_begin_pos;
  long local_1a0;
  size_t replacement_size;
  const_iterator line_end;
  const_iterator line_begin;
  smatch matches;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool in_codeblock;
  mdsection *section;
  iterator __end2;
  iterator __begin2;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> *__range2;
  type *url_idx;
  type *url_regex;
  __normal_iterator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>_>
  local_108;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  *__range1;
  int local_e8 [2];
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long> *local_e0;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long> local_d8;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long> local_b0;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  url_regexes;
  undefined1 local_50 [8];
  regex second_order_url_or_img_regex;
  regex url_or_img_regex;
  mdsplitter *this_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &second_order_url_or_img_regex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"\\[([^\\[\\]]*)\\]\\(([^\\)]*)\\)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50,
             "\\[(!?)\\[([^\\[\\]]*)\\]\\(([^\\)]*)\\)\\]\\(([^\\)]*)\\)",0x10);
  local_e0 = &local_d8;
  local_e8[1] = 2;
  std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_&,_int,_true>
            (local_e0,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                      &second_order_url_or_img_regex._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,local_e8 + 1);
  local_e0 = &local_b0;
  local_e8[0] = 4;
  std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>::
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_&,_int,_true>
            (local_e0,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50,local_e8);
  local_88 = &local_d8;
  local_80 = 2;
  std::
  allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
               *)((long)&__range1 + 7));
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
            *)local_78,__l,
           (allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
            *)((long)&__range1 + 7));
  std::
  allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>
                *)((long)&__range1 + 7));
  local_420 = (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>
               *)&local_88;
  do {
    local_420 = local_420 + -1;
    std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>::
    ~pair(local_420);
  } while (local_420 != &local_d8);
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
                    *)local_78);
  local_108._M_current =
       (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long> *)
       std::
       vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
       ::end((vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
              *)local_78);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end1,&local_108);
    if (!bVar2) {
      std::
      vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>
                 *)local_78);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &second_order_url_or_img_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    __in = __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>_>
           ::operator*(&__end1);
    __re = std::
           get<0ul,std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,unsigned_long>
                     (__in);
    ptVar4 = std::
             get<1ul,std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,unsigned_long>
                       (__in);
    __end2 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::begin
                       (&this->sections_);
    section = (mdsection *)
              std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::end
                        (&this->sections_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                                       *)&section), bVar2) {
      pmVar5 = __gnu_cxx::
               __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
               ::operator*(&__end2);
      bVar2 = false;
      bVar1 = false;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pmVar5->lines);
      line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pmVar5->lines);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&line), bVar3) {
        str = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end3);
        bVar3 = is_codeblock(str);
        if (bVar3) {
          bVar2 = !bVar2;
          bVar1 = bVar2;
        }
        if (!bVar1) {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&line_begin);
          line_end._M_current = (char *)std::__cxx11::string::cbegin();
          replacement_size = std::__cxx11::string::cend();
          do {
            bVar3 = std::
                    regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )line_end._M_current,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )replacement_size,
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&line_begin,__re,0);
            if (!bVar3) break;
            url.field_2._8_8_ = std::__cxx11::string::cbegin();
            dVar6 = __gnu_cxx::operator-
                              (&line_end,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)((long)&url.field_2 + 8));
            pvVar7 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&line_begin,*ptVar4);
            std::__cxx11::sub_match::operator_cast_to_string
                      ((string_type *)local_1e0,(sub_match *)pvVar7);
            bVar3 = is_external((string *)local_1e0);
            if (bVar3) {
              if ((this->trace_ & 1U) != 0) {
                poVar10 = std::operator<<((ostream *)&std::cout,(string *)local_1e0);
                poVar10 = std::operator<<(poVar10," <- (external)");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              }
              local_1a0 = std::__cxx11::string::size();
            }
            else {
              lVar8 = std::__cxx11::string::rfind((char)local_1e0,0x23);
              local_1e1 = lVar8 == 0;
              if ((bool)local_1e1) {
                std::__cxx11::string::substr((ulong)&it,(ulong)local_1e0);
                local_2f0._M_current =
                     (mdsection *)
                     std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::begin
                               (&this->sections_);
                local_2f8 = (mdsection *)
                            std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::
                            end(&this->sections_);
                local_300 = (string *)&it;
                local_2e8 = std::
                            find_if<__gnu_cxx::__normal_iterator<mdsplit::mdsection*,std::vector<mdsplit::mdsection,std::allocator<mdsplit::mdsection>>>,mdsplit::mdsplitter::run_update_links()::__0>
                                      (local_2f0,
                                       (__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                                        )local_2f8,(anon_class_8_1_58253b7d_for__M_pred)local_300);
                local_308._M_current =
                     (mdsection *)
                     std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::end
                               (&this->sections_);
                bVar3 = __gnu_cxx::operator!=(&local_2e8,&local_308);
                if (bVar3) {
                  pmVar14 = __gnu_cxx::
                            __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                            ::operator->(&local_2e8);
                  bVar3 = mdsection::has_content(pmVar14,false,false);
                  if (!bVar3) {
                    __gnu_cxx::
                    __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                    ::operator++(&local_2e8);
                  }
                }
                absolute_destination._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                )std::
                                 vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::
                                 end(&this->sections_);
                bVar3 = __gnu_cxx::operator!=
                                  (&local_2e8,
                                   (__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                                    *)&absolute_destination._M_cmpts);
                if (bVar3) {
                  std::filesystem::current_path_abi_cxx11_();
                  pmVar14 = __gnu_cxx::
                            __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                            ::operator->(&local_2e8);
                  std::filesystem::__cxx11::operator/
                            ((path *)local_338,(path *)&relative_url_1._M_cmpts,&pmVar14->filepath);
                  std::filesystem::__cxx11::path::~path((path *)&relative_url_1._M_cmpts);
                  relative_path((path *)&pos_1,this,(path *)local_338,&pmVar5->filepath);
                  if ((this->trace_ & 1U) != 0) {
                    poVar10 = std::operator<<((ostream *)&std::cout,(string *)local_1e0);
                    poVar10 = std::operator<<(poVar10,"->");
                    pvVar9 = std::filesystem::__cxx11::path::c_str((path *)&pos_1);
                    poVar10 = std::operator<<(poVar10,pvVar9);
                    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                  }
                  local_398 = (char *)std::__cxx11::string::cbegin();
                  local_3a0 = line_end._M_current;
                  dVar11 = std::
                           distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                     ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )local_398,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       )line_end._M_current);
                  dVar12 = std::__cxx11::
                           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&line_begin,*ptVar4);
                  local_390 = dVar11 + dVar12;
                  pvVar7 = std::__cxx11::
                           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)&line_begin,*ptVar4);
                  psVar13 = (string *)
                            std::__cxx11::
                            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::length(pvVar7);
                  std::filesystem::__cxx11::path::string(&local_3c0,(path *)&pos_1);
                  std::__cxx11::string::replace((ulong)str,dVar11 + dVar12,psVar13);
                  std::__cxx11::string::~string((string *)&local_3c0);
                  std::filesystem::__cxx11::path::string((string *)&new_begin_pos,(path *)&pos_1);
                  local_1a0 = std::__cxx11::string::size();
                  std::__cxx11::string::~string((string *)&new_begin_pos);
                  std::filesystem::__cxx11::path::~path((path *)&pos_1);
                  std::filesystem::__cxx11::path::~path((path *)local_338);
                }
                else {
                  if ((this->trace_ & 1U) != 0) {
                    poVar10 = std::operator<<((ostream *)&std::cout,"Cannot find file for a header "
                                             );
                    poVar10 = std::operator<<(poVar10,(string *)local_1e0);
                    poVar10 = std::operator<<(poVar10," whose slug is ");
                    poVar10 = std::operator<<(poVar10,(string *)&it);
                    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                  }
                  local_1a0 = std::__cxx11::string::size();
                }
                std::__cxx11::string::~string((string *)&it);
              }
              else {
                lVar8 = std::__cxx11::string::rfind(local_1e0,0x16e120);
                local_1e2 = lVar8 == 0;
                if ((bool)local_1e2) {
                  local_1f8._M_current = (char *)std::__cxx11::string::begin();
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1f0,
                             &local_1f8);
                  local_210._M_current = (char *)std::__cxx11::string::begin();
                  local_208 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator+(&local_210,2);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_200,
                             &local_208);
                  relative_url._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl = (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  )std::__cxx11::string::erase(local_1e0,local_1f0,local_200);
                }
                std::filesystem::__cxx11::path::
                path<std::__cxx11::string,std::filesystem::__cxx11::path>
                          ((path *)&pos,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,auto_format);
                relative_path((path *)local_240,this,(path *)&pos,&pmVar5->filepath);
                std::filesystem::__cxx11::path::~path((path *)&pos);
                if ((this->trace_ & 1U) != 0) {
                  pvVar9 = std::filesystem::__cxx11::path::c_str(&pmVar5->filepath);
                  poVar10 = std::operator<<((ostream *)&std::cout,pvVar9);
                  poVar10 = std::operator<<(poVar10,": ");
                  poVar10 = std::operator<<(poVar10,(string *)local_1e0);
                  poVar10 = std::operator<<(poVar10," -> ");
                  pvVar9 = std::filesystem::__cxx11::path::c_str((path *)local_240);
                  poVar10 = std::operator<<(poVar10,pvVar9);
                  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                }
                local_278 = (char *)std::__cxx11::string::cbegin();
                local_280 = line_end._M_current;
                dVar11 = std::
                         distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                   ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_278,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )line_end._M_current);
                dVar12 = std::__cxx11::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&line_begin,*ptVar4);
                local_270 = dVar11 + dVar12;
                pvVar7 = std::__cxx11::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&line_begin,*ptVar4);
                psVar13 = (string *)
                          std::__cxx11::
                          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::length(pvVar7);
                std::filesystem::__cxx11::path::string(&local_2a0,(path *)local_240);
                std::__cxx11::string::replace((ulong)str,dVar11 + dVar12,psVar13);
                std::__cxx11::string::~string((string *)&local_2a0);
                std::filesystem::__cxx11::path::string
                          ((string *)((long)&header_slug.field_2 + 8),(path *)local_240);
                local_1a0 = std::__cxx11::string::size();
                std::__cxx11::string::~string((string *)(header_slug.field_2._M_local_buf + 8));
                std::filesystem::__cxx11::path::~path((path *)local_240);
              }
            }
            if (local_1a0 == 0) {
              pvVar7 = std::__cxx11::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&line_begin,*ptVar4);
              local_1a0 = std::__cxx11::
                          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::length(pvVar7);
            }
            dVar12 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&line_begin,*ptVar4);
            uVar15 = dVar6 + dVar12 + local_1a0;
            local_3e8 = uVar15;
            uVar16 = std::__cxx11::string::size();
            if (uVar15 < uVar16) {
              local_3f8._M_current = (char *)std::__cxx11::string::cbegin();
              local_3f0 = (char *)__gnu_cxx::
                                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator+(&local_3f8,local_3e8);
              line_end._M_current = local_3f0;
              replacement_size = std::__cxx11::string::cend();
              local_404 = 0;
            }
            else {
              local_404 = 9;
            }
            std::__cxx11::string::~string((string *)local_1e0);
          } while (local_404 == 0);
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&line_begin);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void mdsplitter::run_update_links() {
        // [some text](URL) -> std::regex{R"([^!]*\[(.*)\]\((.*)\))"};
        // ![some text](URL) -> std::regex{R"(!\[(.*)\]\((.*)\))"};
        std::regex url_or_img_regex{R"(\[([^\[\]]*)\]\(([^\)]*)\))"};

        // [![example_area_1](docs/examples/line_plot/area/area_1.svg)](examples/line_plot/area/area_1.cpp)
        std::regex second_order_url_or_img_regex{
            R"(\[(!?)\[([^\[\]]*)\]\(([^\)]*)\)\]\(([^\)]*)\))"};

        std::vector<std::pair<std::regex, size_t>> url_regexes = {
            {url_or_img_regex, 2}, {second_order_url_or_img_regex, 4}};

        for (const auto &[url_regex, url_idx] : url_regexes) {
            for (auto &section : sections_) {
                bool in_codeblock = false;
                for (auto &line : section.lines) {
                    if (is_codeblock(line)) {
                        in_codeblock = 1 - in_codeblock;
                    }
                    if (in_codeblock) {
                        continue;
                    }
                    std::smatch matches;
                    auto line_begin = line.cbegin();
                    auto line_end = line.cend();
                    size_t replacement_size = 0;
                    while (std::regex_search(line_begin, line_end, matches,
                                             url_regex)) {
                        size_t line_begin_pos = line_begin - line.cbegin();
                        std::string url = matches[url_idx];
                        if (!is_external(url)) {
                            bool is_anchor = url.rfind('#', 0) == 0;
                            if (!is_anchor) {
                                bool is_single_dot_directory =
                                    url.rfind("./", 0) == 0;
                                if (is_single_dot_directory) {
                                    url.erase(url.begin(), url.begin() + 2);
                                }
                                fs::path relative_url =
                                    relative_path(url, section.filepath);
                                if (trace_) {
                                    std::cout << section.filepath.c_str()
                                              << ": " << url << " -> "
                                              << relative_url.c_str()
                                              << std::endl;
                                }
                                size_t pos =
                                    std::distance(line.cbegin(), line_begin) +
                                    matches.position(url_idx);
                                line.replace(pos, matches[url_idx].length(),
                                             relative_url.string());
                                replacement_size = relative_url.string().size();
                            } else {
                                // look for section
                                std::string header_slug = url.substr(1);
                                auto it = std::find_if(
                                    sections_.begin(), sections_.end(),
                                    [&](const mdsection &s) {
                                        return slugify(s.header_name) ==
                                               header_slug;
                                    });

                                // if it's a empty section, point to next
                                // section this is important for empty
                                // categories for which mkdocs creates no links
                                if (it != sections_.end()) {
                                    if (!it->has_content()) {
                                        ++it;
                                    }
                                }

                                // if link to valid section
                                if (it != sections_.end()) {
                                    fs::path absolute_destination =
                                        fs::current_path() / it->filepath;
                                    fs::path relative_url = relative_path(
                                        absolute_destination, section.filepath);
                                    if (trace_) {
                                        std::cout << url << "->"
                                                  << relative_url.c_str()
                                                  << std::endl;
                                    }
                                    size_t pos = std::distance(line.cbegin(),
                                                               line_begin) +
                                                 matches.position(url_idx);
                                    line.replace(pos, matches[url_idx].length(),
                                                 relative_url.string());
                                    replacement_size =
                                        relative_url.string().size();
                                } else {
                                    // not link to a valid section
                                    // we hope we didn't get here
                                    if (trace_) {
                                        std::cout
                                            << "Cannot find file for a header "
                                            << url << " whose slug is "
                                            << header_slug << std::endl;
                                    }
                                    replacement_size = url.size();
                                }
                            }
                        } else {
                            if (trace_) {
                                std::cout << url << " <- (external)"
                                          << std::endl;
                            }
                            replacement_size = url.size();
                        }
                        if (replacement_size == 0) {
                            replacement_size = matches[url_idx].length();
                        }
                        size_t new_begin_pos = line_begin_pos +
                                               matches.position(url_idx) +
                                               replacement_size;
                        if (new_begin_pos < line.size()) {
                            line_begin = line.cbegin() + new_begin_pos;
                            line_end = line.cend();
                        } else {
                            break;
                        }
                    }
                }
            }
        }
    }